

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_wrapper_v(uchar *script,size_t script_len,size_t *write_len)

{
  size_t sVar1;
  size_t used_len;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  
  sVar1 = *write_len;
  if (sVar1 == 0) {
    return -2;
  }
  if (script[sVar1 - 1] == 0x87) {
    script[sVar1 - 1] = 0x88;
  }
  else if (script[sVar1 - 1] == 0x9c) {
    script[sVar1 - 1] = 0x9d;
  }
  else if (script[sVar1 - 1] == 0xac) {
    script[sVar1 - 1] = 0xad;
  }
  else if (script[sVar1 - 1] == 0xae) {
    script[sVar1 - 1] = 0xaf;
  }
  else if (script[sVar1 - 1] == 0xae) {
    script[sVar1 - 1] = 0xaf;
  }
  else {
    if (script_len < sVar1 + 1) {
      return -2;
    }
    script[sVar1] = 'i';
    *write_len = sVar1 + 1;
    if (10000 < *write_len) {
      return -2;
    }
  }
  return 0;
}

Assistant:

static int generate_by_wrapper_v(
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    size_t used_len = *write_len;
    if (!used_len)
        return WALLY_EINVAL;

    if (script[used_len - 1] == OP_EQUAL) {
        script[used_len - 1] = OP_EQUALVERIFY;
    } else if (script[used_len - 1] == OP_NUMEQUAL) {
        script[used_len - 1] = OP_NUMEQUALVERIFY;
    } else if (script[used_len - 1] == OP_CHECKSIG) {
        script[used_len - 1] = OP_CHECKSIGVERIFY;
    } else if (script[used_len - 1] == OP_CHECKMULTISIG) {
        script[used_len - 1] = OP_CHECKMULTISIGVERIFY;
    } else if (script[used_len - 1] == OP_CHECKMULTISIG) {
        script[used_len - 1] = OP_CHECKMULTISIGVERIFY;
    } else if ((used_len + 1) > script_len) {
        return WALLY_EINVAL;
    } else {
        script[used_len] = OP_VERIFY;
        *write_len = used_len + 1;
        if (*write_len > DESCRIPTOR_WITNESS_SCRIPT_MAX_SIZE)
            return WALLY_EINVAL;
    }
    return WALLY_OK;
}